

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForScalarVectorFieldHelper
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,int indents)

{
  string local_288 [8];
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  Type vectortype;
  string struct_type;
  undefined1 local_78 [8];
  string field_method;
  string field_field;
  string *code;
  int indents_local;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_78,&(this->namer_).super_Namer,field);
  IdlNamer::Type_abi_cxx11_((string *)&vectortype.fixed_length,&this->namer_,struct_def);
  Type::VectorType((Type *)local_c8,&(field->value).type);
  GenIndents_abi_cxx11_(&local_1a8,this,indents);
  std::operator+(&local_188,&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vectortype.fixed_length);
  std::operator+(&local_168,&local_188,"Start");
  std::operator+(&local_148,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::operator+(&local_128,&local_148,"Vector(builder, len(self.");
  std::operator+(&local_108,&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_e8,&local_108,"))");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  GenIndents_abi_cxx11_(&local_228,this,indents);
  std::operator+(&local_208,&local_228,"for i in reversed(range(len(self.");
  std::operator+(&local_1e8,&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_1c8,&local_1e8,"))):");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  GenIndents_abi_cxx11_((string *)((long)&type_name.field_2 + 8),this,indents + 1);
  std::operator+(&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type_name.field_2 + 8),"builder.Prepend");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_288);
  switch(local_c8._0_4_) {
  case 2:
    std::__cxx11::string::operator=(local_288,"Bool");
    break;
  case 3:
    std::__cxx11::string::operator=(local_288,"Byte");
    break;
  case 4:
    std::__cxx11::string::operator=(local_288,"Uint8");
    break;
  case 5:
    std::__cxx11::string::operator=(local_288,"Int16");
    break;
  case 6:
    std::__cxx11::string::operator=(local_288,"Uint16");
    break;
  case 7:
    std::__cxx11::string::operator=(local_288,"Int32");
    break;
  case 8:
    std::__cxx11::string::operator=(local_288,"Uint32");
    break;
  case 9:
    std::__cxx11::string::operator=(local_288,"Int64");
    break;
  case 10:
    std::__cxx11::string::operator=(local_288,"Uint64");
    break;
  case 0xb:
    std::__cxx11::string::operator=(local_288,"Float32");
    break;
  case 0xc:
    std::__cxx11::string::operator=(local_288,"Float64");
    break;
  case 0xd:
    std::__cxx11::string::operator=(local_288,"UOffsetTRelative");
    break;
  default:
    std::__cxx11::string::operator=(local_288,"VOffsetT");
  }
  std::__cxx11::string::operator+=((string *)code_ptr,local_288);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string((string *)&vectortype.fixed_length);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenPackForScalarVectorFieldHelper(const StructDef &struct_def,
                                         const FieldDef &field,
                                         std::string *code_ptr,
                                         int indents) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);
    const auto vectortype = field.value.type.VectorType();

    code += GenIndents(indents) + struct_type + "Start" + field_method +
            "Vector(builder, len(self." + field_field + "))";
    code += GenIndents(indents) + "for i in reversed(range(len(self." +
            field_field + "))):";
    code += GenIndents(indents + 1) + "builder.Prepend";

    std::string type_name;
    switch (vectortype.base_type) {
      case BASE_TYPE_BOOL: type_name = "Bool"; break;
      case BASE_TYPE_CHAR: type_name = "Byte"; break;
      case BASE_TYPE_UCHAR: type_name = "Uint8"; break;
      case BASE_TYPE_SHORT: type_name = "Int16"; break;
      case BASE_TYPE_USHORT: type_name = "Uint16"; break;
      case BASE_TYPE_INT: type_name = "Int32"; break;
      case BASE_TYPE_UINT: type_name = "Uint32"; break;
      case BASE_TYPE_LONG: type_name = "Int64"; break;
      case BASE_TYPE_ULONG: type_name = "Uint64"; break;
      case BASE_TYPE_FLOAT: type_name = "Float32"; break;
      case BASE_TYPE_DOUBLE: type_name = "Float64"; break;
      case BASE_TYPE_STRING: type_name = "UOffsetTRelative"; break;
      default: type_name = "VOffsetT"; break;
    }
    code += type_name;
  }